

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

CURLcode send_telnet_data(connectdata *conn,char *buffer,ssize_t nread)

{
  char cVar1;
  int iVar2;
  CURLcode CVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  ssize_t bytes_written;
  pollfd pfd [1];
  ssize_t local_40;
  pollfd local_38;
  
  if (nread < 1) {
    CVar3 = CURLE_OK;
  }
  else {
    lVar6 = 0;
    lVar4 = 0;
    do {
      lVar4 = lVar4 + (ulong)(buffer[lVar6] == -1);
      lVar6 = lVar6 + 1;
    } while (nread != lVar6);
    lVar6 = lVar4 + nread;
    pcVar5 = buffer;
    if (lVar4 != 0) {
      pcVar5 = (char *)(*Curl_cmalloc)(lVar6 + 1);
      if (pcVar5 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      lVar4 = 0;
      if (0 < nread) {
        lVar7 = 0;
        do {
          cVar1 = buffer[lVar7];
          pcVar5[lVar4] = cVar1;
          if (cVar1 == -1) {
            pcVar5[lVar4 + 1] = -1;
            lVar4 = lVar4 + 2;
          }
          else {
            lVar4 = lVar4 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (nread != lVar7);
      }
      pcVar5[lVar4] = '\0';
    }
    lVar4 = 0;
    while( true ) {
      local_38.fd = conn->sock[0];
      local_38.events = 4;
      iVar2 = Curl_poll(&local_38,1,-1);
      if (iVar2 + 1U < 2) break;
      local_40 = 0;
      CVar3 = Curl_write(conn,conn->sock[0],pcVar5 + lVar4,lVar6 - lVar4,&local_40);
      if ((CVar3 != CURLE_OK) || (lVar4 = lVar4 + local_40, lVar6 <= lVar4)) goto LAB_0012115e;
    }
    CVar3 = CURLE_SEND_ERROR;
LAB_0012115e:
    if (pcVar5 != buffer) {
      (*Curl_cfree)(pcVar5);
    }
  }
  return CVar3;
}

Assistant:

static CURLcode send_telnet_data(struct connectdata *conn,
                                 char *buffer, ssize_t nread)
{
  ssize_t escapes, i, outlen;
  unsigned char *outbuf = NULL;
  CURLcode result = CURLE_OK;
  ssize_t bytes_written, total_written;

  /* Determine size of new buffer after escaping */
  escapes = 0;
  for(i = 0; i < nread; i++)
    if((unsigned char)buffer[i] == CURL_IAC)
      escapes++;
  outlen = nread + escapes;

  if(outlen == nread)
    outbuf = (unsigned char *)buffer;
  else {
    ssize_t j;
    outbuf = malloc(nread + escapes + 1);
    if(!outbuf)
      return CURLE_OUT_OF_MEMORY;

    j = 0;
    for(i = 0; i < nread; i++) {
      outbuf[j++] = buffer[i];
      if((unsigned char)buffer[i] == CURL_IAC)
        outbuf[j++] = CURL_IAC;
    }
    outbuf[j] = '\0';
  }

  total_written = 0;
  while(!result && total_written < outlen) {
    /* Make sure socket is writable to avoid EWOULDBLOCK condition */
    struct pollfd pfd[1];
    pfd[0].fd = conn->sock[FIRSTSOCKET];
    pfd[0].events = POLLOUT;
    switch(Curl_poll(pfd, 1, -1)) {
      case -1:                    /* error, abort writing */
      case 0:                     /* timeout (will never happen) */
        result = CURLE_SEND_ERROR;
        break;
      default:                    /* write! */
        bytes_written = 0;
        result = Curl_write(conn, conn->sock[FIRSTSOCKET],
                            outbuf + total_written,
                            outlen - total_written,
                            &bytes_written);
        total_written += bytes_written;
        break;
    }
  }

  /* Free malloc copy if escaped */
  if(outbuf != (unsigned char *)buffer)
    free(outbuf);

  return result;
}